

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O2

void handle_write(cio_io_stream *io_stream,void *handler_context,cio_write_buffer *buffer,
                 cio_error err,size_t bytes_transferred)

{
  cio_write_buffer *wbh;
  cio_write_buffer *new_wb;
  int iVar1;
  cio_write_buffer *new_wb_00;
  ulong uVar2;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar3;
  cio_write_buffer *write_buffer;
  
  wbh = (cio_write_buffer *)((long)handler_context + 0x50);
  new_wb_00 = cio_write_buffer_queue_dequeue(wbh);
  new_wb = (cio_write_buffer *)((long)handler_context + 0x70);
  if (err == CIO_SUCCESS) {
    while (new_wb_00 != (cio_write_buffer *)0x0) {
      uVar2 = (new_wb_00->data).element.length;
      if (bytes_transferred < uVar2) {
        if (new_wb != new_wb_00) {
          cio_write_buffer_queue_tail
                    (*(cio_write_buffer **)((long)handler_context + 0x48),new_wb_00);
          uVar2 = (new_wb_00->data).element.length;
        }
        *(size_t *)((long)handler_context + 0x80) = bytes_transferred + (new_wb_00->data).head.q_len
        ;
        *(ulong *)((long)handler_context + 0x88) = uVar2 - bytes_transferred;
        cio_write_buffer_queue_head(wbh,new_wb);
        break;
      }
      if (new_wb != new_wb_00) {
        cio_write_buffer_queue_tail(*(cio_write_buffer **)((long)handler_context + 0x48),new_wb_00);
      }
      new_wb_00 = cio_write_buffer_queue_dequeue(wbh);
      bytes_transferred = bytes_transferred - uVar2;
    }
    if (wbh->next != wbh) {
      iVar1 = (**(code **)(*handler_context + 8))(io_stream,wbh,handle_write,handler_context);
      if (iVar1 == 0) {
        return;
      }
      (**(code **)((long)handler_context + 0x38))
                (handler_context,*(undefined8 *)((long)handler_context + 0x40),iVar1,
                 *(code **)((long)handler_context + 0x38));
      return;
    }
    UNRECOVERED_JUMPTABLE = *(code **)((long)handler_context + 0x38);
    uVar3 = *(undefined8 *)((long)handler_context + 0x40);
    err = CIO_SUCCESS;
  }
  else {
    while (new_wb_00 != (cio_write_buffer *)0x0) {
      if (new_wb != new_wb_00) {
        cio_write_buffer_queue_tail(*(cio_write_buffer **)((long)handler_context + 0x48),new_wb_00);
      }
      new_wb_00 = cio_write_buffer_queue_dequeue(wbh);
    }
    UNRECOVERED_JUMPTABLE = *(code **)((long)handler_context + 0x38);
    uVar3 = *(undefined8 *)((long)handler_context + 0x40);
  }
  (*UNRECOVERED_JUMPTABLE)(handler_context,uVar3,err);
  return;
}

Assistant:

static void handle_write(struct cio_io_stream *io_stream, void *handler_context, struct cio_write_buffer *buffer, enum cio_error err, size_t bytes_transferred)
{
	(void)buffer;

	struct cio_buffered_stream *buffered_stream = handler_context;
	if (cio_unlikely(err != CIO_SUCCESS)) {
		struct cio_write_buffer *write_buffer = cio_write_buffer_queue_dequeue(&buffered_stream->wbh);
		while (write_buffer != NULL) {
			if (!buffer_is_temp_buffer(buffered_stream, write_buffer)) {
				cio_write_buffer_queue_tail(buffered_stream->original_wbh, write_buffer);
			}
			write_buffer = cio_write_buffer_queue_dequeue(&buffered_stream->wbh);
		}

		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		return;
	}

	struct cio_write_buffer *write_buffer = cio_write_buffer_queue_dequeue(&buffered_stream->wbh);
	while (write_buffer != NULL) {
		if (buffer_partially_written(write_buffer, bytes_transferred)) {
			if (!buffer_is_temp_buffer(buffered_stream, write_buffer)) {
				cio_write_buffer_queue_tail(buffered_stream->original_wbh, write_buffer);
			}

			const void *new_data = &((const uint8_t *)write_buffer->data.element.const_data)[bytes_transferred];
			size_t new_length = write_buffer->data.element.length - bytes_transferred;
			cio_write_buffer_const_element_init(&buffered_stream->write_buffer, new_data, new_length);
			cio_write_buffer_queue_head(&buffered_stream->wbh, &buffered_stream->write_buffer);
			break;
		}

		bytes_transferred -= write_buffer->data.element.length;
		if (!buffer_is_temp_buffer(buffered_stream, write_buffer)) {
			cio_write_buffer_queue_tail(buffered_stream->original_wbh, write_buffer);
		}

		write_buffer = cio_write_buffer_queue_dequeue(&buffered_stream->wbh);
	}

	if (cio_write_buffer_queue_empty(&buffered_stream->wbh)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, CIO_SUCCESS);
	} else {
		err = buffered_stream->stream->write_some(io_stream, &buffered_stream->wbh, handle_write, buffered_stream);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		}
	}
}